

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

void helper_mwait_x86_64(CPUX86State *env,int next_eip_addend)

{
  uintptr_t unaff_retaddr;
  
  if ((int)env->regs[1] != 0) {
    raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
  }
  cpu_svm_check_intercept_param_x86_64(env,0x8b,0,unaff_retaddr);
  env->eip = env->eip + (long)next_eip_addend;
  if (*(int *)((long)env[-1].hi16_zmm_regs + 0x3e0) != 0) {
    return;
  }
  *(byte *)&env->hflags = (byte)env->hflags & 0xf7;
  *(undefined4 *)((long)env[-1].hi16_zmm_regs + 1000) = 1;
  *(undefined4 *)((long)env[-1].hi16_zmm_regs + 0x3f0) = 0x10001;
  cpu_loop_exit_x86_64((CPUState *)(env[-6].mtrr_var + 4));
}

Assistant:

void helper_mwait(CPUX86State *env, int next_eip_addend)
{
    CPUState *cs = env_cpu(env);
    X86CPU *cpu = env_archcpu(env);

    if ((uint32_t)env->regs[R_ECX] != 0) {
        raise_exception_ra(env, EXCP0D_GPF, GETPC());
    }

    cpu_svm_check_intercept_param(env, SVM_EXIT_MWAIT, 0, GETPC());
    env->eip += next_eip_addend;

    /* XXX: not complete but not completely erroneous */
    // if (cs->cpu_index != 0 || CPU_NEXT(cs) != NULL) { // TODO
    if (cs->cpu_index != 0) {
        // do_pause(cpu);
    } else {
        do_hlt(cpu);
    }
}